

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3NextMethod(sqlite3_vtab_cursor *pCursor)

{
  u8 uVar1;
  sqlite3_vtab *pStmt;
  Fts3Expr *pExpr;
  uint in_EAX;
  int iVar2;
  Mem *pMem;
  sqlite3_vtab *psVar3;
  undefined8 uStack_28;
  
  if (*(ushort *)&pCursor[1].pVtab < 2) {
    iVar2 = sqlite3_step((sqlite3_stmt *)pCursor[2].pVtab);
    if (iVar2 != 100) {
      *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
      iVar2 = sqlite3_reset((sqlite3_stmt *)pCursor[2].pVtab);
      return iVar2;
    }
    pStmt = pCursor[2].pVtab;
    pMem = columnMem((sqlite3_stmt *)pStmt,0);
    psVar3 = (sqlite3_vtab *)sqlite3VdbeIntValue(pMem);
    columnMallocFailure((sqlite3_stmt *)pStmt);
    pCursor[6].pVtab = psVar3;
    uStack_28._4_4_ = 0;
  }
  else {
    uStack_28 = (ulong)in_EAX;
    pExpr = (Fts3Expr *)pCursor[3].pVtab;
    if (pExpr == (Fts3Expr *)0x0) {
      *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
    }
    else {
      do {
        if (*(char *)((long)&pCursor[1].pVtab + 3) == '\0') {
          sqlite3_reset((sqlite3_stmt *)pCursor[2].pVtab);
        }
        fts3EvalNextRow((Fts3Cursor *)pCursor,pExpr,(int *)((long)&uStack_28 + 4));
        uVar1 = pExpr->bEof;
        *(u8 *)((long)&pCursor[1].pVtab + 2) = uVar1;
        *(undefined1 *)((long)&pCursor[1].pVtab + 3) = 1;
        *(undefined4 *)&pCursor[0xe].pVtab = 1;
        pCursor[6].pVtab = (sqlite3_vtab *)pExpr->iDocid;
      } while ((uVar1 == '\0') &&
              (iVar2 = sqlite3Fts3EvalTestDeferred
                                 ((Fts3Cursor *)pCursor,(int *)((long)&uStack_28 + 4)), iVar2 != 0))
      ;
    }
    if (uStack_28._4_4_ == 0) {
      if (*(char *)((long)&pCursor[9].pVtab + 4) == '\0') {
        if ((long)pCursor[6].pVtab <= (long)pCursor[0xd].pVtab) {
          return 0;
        }
      }
      else if ((long)pCursor[0xc].pVtab <= (long)pCursor[6].pVtab) {
        return 0;
      }
      *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
    }
  }
  return uStack_28._4_4_;
}

Assistant:

static int fts3NextMethod(sqlite3_vtab_cursor *pCursor){
  int rc;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;
  if( pCsr->eSearch==FTS3_DOCID_SEARCH || pCsr->eSearch==FTS3_FULLSCAN_SEARCH ){
    if( SQLITE_ROW!=sqlite3_step(pCsr->pStmt) ){
      pCsr->isEof = 1;
      rc = sqlite3_reset(pCsr->pStmt);
    }else{
      pCsr->iPrevId = sqlite3_column_int64(pCsr->pStmt, 0);
      rc = SQLITE_OK;
    }
  }else{
    rc = fts3EvalNext((Fts3Cursor *)pCursor);
  }
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}